

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

DatabaseInterface * Fossilize::create_database(char *path,DatabaseMode mode)

{
  bool bVar1;
  DatabaseInterface *pDVar2;
  string ext;
  allocator local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,path,&local_61);
  Path::ext(&local_60,&local_40);
  std::__cxx11::string::_M_dispose();
  bVar1 = std::operator==(&local_60,"foz");
  if (bVar1) {
    pDVar2 = create_stream_archive_database(path,mode);
  }
  else {
    bVar1 = std::operator==(&local_60,"zip");
    if (bVar1) {
      pDVar2 = create_zip_archive_database(path,mode);
    }
    else {
      pDVar2 = create_dumb_folder_database(path,mode);
    }
  }
  std::__cxx11::string::_M_dispose();
  return pDVar2;
}

Assistant:

DatabaseInterface *create_database(const char *path, DatabaseMode mode)
{
	auto ext = Path::ext(path);
	if (ext == "foz")
		return create_stream_archive_database(path, mode);
	else if (ext == "zip")
		return create_zip_archive_database(path, mode);
	else
		return create_dumb_folder_database(path, mode);
}